

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::
ValidateNamingStyle<google::protobuf::EnumDescriptor,google::protobuf::EnumDescriptorProto>
          (DescriptorBuilder *this,EnumDescriptor *enum_descriptor,EnumDescriptorProto *proto)

{
  ushort *puVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar2;
  string *in_RCX;
  anon_unknown_24 *this_00;
  string_view name;
  string_view element_name;
  string error;
  EnumDescriptor *local_68;
  VoidPtr local_60;
  code *pcStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  EnumDescriptor **local_30;
  undefined1 **local_28;
  
  local_48 = 0;
  local_40 = 0;
  puVar1 = (ushort *)(enum_descriptor->all_names_).payload_;
  this_00 = (anon_unknown_24 *)(ulong)*puVar1;
  name._M_len = (long)puVar1 + ~(ulong)this_00;
  name._M_str = (char *)&local_50;
  local_68 = enum_descriptor;
  local_50 = &local_40;
  bVar2 = anon_unknown_24::IsValidTitleCaseName(this_00,name,in_RCX);
  if (!bVar2) {
    local_30 = &local_68;
    puVar1 = (ushort *)(local_68->all_names_).payload_;
    element_name._M_len = (ulong)*puVar1;
    element_name._M_str = (char *)((long)puVar1 + ~element_name._M_len);
    local_60.obj = &local_30;
    pcStack_58 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::EnumDescriptor,google::protobuf::EnumDescriptorProto>(google::protobuf::EnumDescriptor_const*,google::protobuf::EnumDescriptorProto_const&)::__0,std::__cxx11::string>
    ;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::EnumDescriptor,google::protobuf::EnumDescriptorProto>(google::protobuf::EnumDescriptor_const*,google::protobuf::EnumDescriptorProto_const&)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.obj = local_60.obj;
    local_28 = &local_50;
    AddError(this,element_name,&proto->super_Message,NAME,make_error);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateNamingStyle(
    const EnumDescriptor* enum_descriptor, const EnumDescriptorProto& proto) {
  std::string error;
  if (!IsValidTitleCaseName(enum_descriptor->name(), &error)) {
    AddError(enum_descriptor->name(), proto,
             DescriptorPool::ErrorCollector::NAME, [&] {
               return absl::StrCat("Enum name ", enum_descriptor->name(), " ",
                                   error, kNamingStyleOptOutMessage);
             });
  }
}